

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

int __thiscall MD5::MD5::init(MD5 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong in_RDX;
  uint uVar5;
  ulong uVar6;
  
  this->finished = false;
  uVar1 = this->count[0];
  uVar5 = uVar1 >> 3 & 0x3f;
  uVar4 = (ulong)uVar5;
  uVar3 = (int)in_RDX * 8;
  this->count[0] = uVar3 + uVar1;
  if (CARRY4(uVar3,uVar1)) {
    this->count[1] = this->count[1] + 1;
  }
  this->count[1] = this->count[1] + ((uint)(in_RDX >> 0x1d) & 7);
  uVar6 = 0x40 - uVar4;
  if (in_RDX < uVar6) {
    uVar6 = 0;
  }
  else {
    memcpy(this->buffer + uVar4,ctx,uVar6);
    transform(this,this->buffer);
    if ((uVar5 ^ 0x7f) < in_RDX) {
      uVar1 = uVar5 ^ 0xbf;
      do {
        uVar3 = uVar1;
        transform(this,(byte *)(ctx + (uVar3 - 0x7f)));
        uVar1 = uVar3 + 0x40;
      } while (uVar3 < in_RDX);
      uVar6 = (ulong)(uVar3 - 0x3f);
    }
    uVar6 = uVar6 & 0xffffffff;
    uVar4 = 0;
  }
  pvVar2 = memcpy(this->buffer + uVar4,ctx + uVar6,in_RDX - uVar6);
  return (int)pvVar2;
}

Assistant:

void MD5::init(const byte* input, size_t len) {

  bit32 i, index, partLen;

  finished = false;

  /* Compute number of bytes mod 64 */
  index = (bit32)((count[0] >> 3) & 0x3f);

  /* update number of bits */
  if ((count[0] += ((bit32)len << 3)) < ((bit32)len << 3)) {
    ++count[1];
  }
  count[1] += ((bit32)len >> 29);

  partLen = 64 - index;

  /* transform as many times as possible. */
  if (len >= partLen) {

    memcpy(&buffer[index], input, partLen);
    transform(buffer);

    for (i = partLen; i + 63 < len; i += 64) {
      transform(&input[i]);
    }
    index = 0;

  } else {
    i = 0;
  }

  /* Buffer remaining input */
  memcpy(&buffer[index], &input[i], len - i);
}